

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.cpp
# Opt level: O0

void __thiscall CCharacterCore::Move(CCharacterCore *this)

{
  vector2_base<float> in_RDI;
  bool *pDeath;
  long in_FS_OFFSET;
  float fVar1;
  float fVar2;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar3;
  float fVar4;
  vector2_base<float> vVar5;
  vec2 in_stack_00000008;
  float D;
  CCharacterCore *pCharCore;
  int p;
  float a;
  int i;
  int End;
  float Distance;
  float RampValue;
  vec2 Pos;
  vec2 LastPos;
  vec2 NewPos;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  long lVar6;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  vector2_base<float> in_stack_ffffffffffffffa0;
  anon_union_4_2_94730284_for_vector2_base<float>_1 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int local_50;
  vector2_base<float> local_20;
  vector2_base<float> local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)in_RDI != 0) {
    pDeath = (bool *)((long)in_RDI + 0x18);
    length((vector2_base<float> *)0x16c189);
    fVar1 = CTuneParam::operator_cast_to_float((CTuneParam *)(*(long *)in_RDI + 0x34));
    CTuneParam::operator_cast_to_float((CTuneParam *)(*(long *)in_RDI + 0x38));
    CTuneParam::operator_cast_to_float((CTuneParam *)(*(long *)in_RDI + 0x3c));
    fVar2 = VelocityRamp(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                         in_stack_ffffffffffffff68,0.0);
    *(float *)((long)in_RDI + 0x18) = *(float *)((long)in_RDI + 0x18) * fVar2;
    local_10 = *(long *)((long)in_RDI + 0x10);
    lVar6 = *(long *)((long)in_RDI + 8);
    vector2_base<float>::vector2_base(&local_18,28.0,28.0);
    CCollision::MoveBox((CCollision *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        (vec2 *)in_stack_ffffffffffffffa0,
                        (vec2 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                        in_stack_00000008,in_RDI.field_1.y,pDeath);
    *(float *)((long)in_RDI + 0x18) = *(float *)((long)in_RDI + 0x18) * (1.0 / fVar2);
    fVar2 = CTuneParam::operator_cast_to_float((CTuneParam *)(*(long *)in_RDI + 0x78));
    if ((fVar2 != 0.0) || (NAN(fVar2))) {
      fVar2 = distance<float>((vector2_base<float> *)CONCAT44(fVar1,in_stack_ffffffffffffff70),
                              (vector2_base<float> *)
                              CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      local_20 = *(vector2_base<float> *)((long)in_RDI + 0x10);
      for (local_50 = 0; local_50 < (int)(fVar2 + 1.0); local_50 = local_50 + 1) {
        aVar3.y = (float)local_50 / fVar2;
        vVar5.field_1.y = aVar3.y;
        vVar5.field_0 = in_stack_ffffffffffffffa8;
        vVar5 = mix<vector2_base<float>,float>
                          (vVar5,in_stack_ffffffffffffffa0,(float)((ulong)lVar6 >> 0x20));
        for (in_stack_ffffffffffffffa8.x = 0.0; (int)in_stack_ffffffffffffffa8 < 0x40;
            in_stack_ffffffffffffffa8.x = in_stack_ffffffffffffffa8.x + 1) {
          in_stack_ffffffffffffffa0 =
               *(vector2_base<float> *)
                (*(long *)in_RDI + 0x80 + (long)(int)in_stack_ffffffffffffffa8 * 8);
          if ((((in_stack_ffffffffffffffa0 != (vector2_base<float>)0x0) &&
               (in_stack_ffffffffffffffa0 != in_RDI)) &&
              (fVar4 = distance<float>((vector2_base<float> *)
                                       CONCAT44(fVar1,in_stack_ffffffffffffff70),
                                       (vector2_base<float> *)
                                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                                      ), fVar4 < 28.0)) && (0.0 <= fVar4)) {
            if (aVar3.y <= 0.0) {
              fVar1 = distance<float>((vector2_base<float> *)
                                      CONCAT44(fVar1,in_stack_ffffffffffffff70),
                                      (vector2_base<float> *)
                                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))
              ;
              if (fVar4 < fVar1) {
                *(long *)((long)in_RDI + 0x10) = local_10;
              }
            }
            else {
              *(vector2_base<float> *)((long)in_RDI + 0x10) = local_20;
            }
            goto LAB_0016c457;
          }
        }
        local_20 = vVar5;
      }
    }
    *(long *)((long)in_RDI + 0x10) = local_10;
  }
LAB_0016c457:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CCharacterCore::Move()
{
	if(!m_pWorld)
		return;

	float RampValue = VelocityRamp(length(m_Vel)*50, m_pWorld->m_Tuning.m_VelrampStart, m_pWorld->m_Tuning.m_VelrampRange, m_pWorld->m_Tuning.m_VelrampCurvature);

	m_Vel.x = m_Vel.x*RampValue;

	vec2 NewPos = m_Pos;
	m_pCollision->MoveBox(&NewPos, &m_Vel, vec2(PHYS_SIZE, PHYS_SIZE), 0, &m_Death);

	m_Vel.x = m_Vel.x*(1.0f/RampValue);

	if(m_pWorld->m_Tuning.m_PlayerCollision)
	{
		// check player collision
		float Distance = distance(m_Pos, NewPos);
		int End = Distance+1;
		vec2 LastPos = m_Pos;
		for(int i = 0; i < End; i++)
		{
			float a = i/Distance;
			vec2 Pos = mix(m_Pos, NewPos, a);
			for(int p = 0; p < MAX_CLIENTS; p++)
			{
				CCharacterCore *pCharCore = m_pWorld->m_apCharacters[p];
				if(!pCharCore || pCharCore == this)
					continue;
				float D = distance(Pos, pCharCore->m_Pos);
				if(D < PHYS_SIZE && D >= 0.0f)
				{
					if(a > 0.0f)
						m_Pos = LastPos;
					else if(distance(NewPos, pCharCore->m_Pos) > D)
						m_Pos = NewPos;
					return;
				}
			}
			LastPos = Pos;
		}
	}

	m_Pos = NewPos;
}